

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_buf.cc
# Opt level: O0

size_t readto(io_buf *i,char **pointer,char terminal)

{
  _func_int **pp_Var1;
  char *pcVar2;
  char **ppcVar3;
  long lVar4;
  size_t __n;
  size_t sVar5;
  ssize_t sVar6;
  ulong uVar7;
  undefined1 in_DL;
  io_buf *in_RSI;
  long in_RDI;
  bool bVar8;
  size_t n_1;
  size_t left;
  size_t n;
  undefined8 in_stack_ffffffffffffffd8;
  char terminal_00;
  undefined4 in_stack_ffffffffffffffe0;
  undefined3 in_stack_ffffffffffffffe4;
  int f;
  size_t local_8;
  
  f = CONCAT13(in_DL,in_stack_ffffffffffffffe4);
  in_RSI->_vptr_io_buf = *(_func_int ***)(in_RDI + 0x60);
  while( true ) {
    pp_Var1 = in_RSI->_vptr_io_buf;
    ppcVar3 = v_array<char>::end((v_array<char> *)(in_RDI + 0x10));
    bVar8 = false;
    if (pp_Var1 < *ppcVar3) {
      bVar8 = *(char *)in_RSI->_vptr_io_buf != (char)((uint)f >> 0x18);
    }
    if (!bVar8) break;
    in_RSI->_vptr_io_buf = (_func_int **)((long)in_RSI->_vptr_io_buf + 1);
  }
  pp_Var1 = in_RSI->_vptr_io_buf;
  ppcVar3 = v_array<char>::end((v_array<char> *)(in_RDI + 0x10));
  if (pp_Var1 == (_func_int **)*ppcVar3) {
    ppcVar3 = v_array<char>::end((v_array<char> *)(in_RDI + 0x10));
    if (*ppcVar3 == *(char **)(in_RDI + 0x20)) {
      ppcVar3 = v_array<char>::end((v_array<char> *)(in_RDI + 0x10));
      __n = (long)*ppcVar3 - *(long *)(in_RDI + 0x60);
      ppcVar3 = v_array<char>::begin((v_array<char> *)(in_RDI + 0x10));
      memmove(*ppcVar3,*(void **)(in_RDI + 0x60),__n);
      ppcVar3 = v_array<char>::begin((v_array<char> *)(in_RDI + 0x10));
      *(char **)(in_RDI + 0x60) = *ppcVar3;
      ppcVar3 = v_array<char>::begin((v_array<char> *)(in_RDI + 0x10));
      pcVar2 = *ppcVar3;
      ppcVar3 = v_array<char>::end((v_array<char> *)(in_RDI + 0x10));
      *ppcVar3 = pcVar2 + __n;
      ppcVar3 = v_array<char>::end((v_array<char> *)(in_RDI + 0x10));
      in_RSI->_vptr_io_buf = (_func_int **)*ppcVar3;
    }
    uVar7 = *(ulong *)(in_RDI + 0x58);
    sVar5 = v_array<int>::size((v_array<int> *)(in_RDI + 0x30));
    terminal_00 = (char)((ulong)in_stack_ffffffffffffffd8 >> 0x38);
    if (uVar7 < sVar5) {
      v_array<int>::operator[]((v_array<int> *)(in_RDI + 0x30),*(size_t *)(in_RDI + 0x58));
      sVar6 = io_buf::fill(in_RSI,f);
      if (0 < sVar6) {
        sVar5 = readto(in_RSI,(char **)CONCAT44(f,in_stack_ffffffffffffffe0),terminal_00);
        return sVar5;
      }
    }
    uVar7 = *(long *)(in_RDI + 0x58) + 1;
    *(ulong *)(in_RDI + 0x58) = uVar7;
    sVar5 = v_array<int>::size((v_array<int> *)(in_RDI + 0x30));
    if (uVar7 < sVar5) {
      local_8 = readto(in_RSI,(char **)CONCAT44(f,in_stack_ffffffffffffffe0),terminal_00);
    }
    else {
      local_8 = (long)in_RSI->_vptr_io_buf - *(long *)(in_RDI + 0x60);
      *(_func_int ***)(in_RDI + 0x60) = in_RSI->_vptr_io_buf;
      in_RSI->_vptr_io_buf = (_func_int **)((long)in_RSI->_vptr_io_buf - local_8);
    }
  }
  else {
    lVar4 = (long)in_RSI->_vptr_io_buf - *(long *)(in_RDI + 0x60);
    *(long *)(in_RDI + 0x60) = (long)in_RSI->_vptr_io_buf + 1;
    in_RSI->_vptr_io_buf = (_func_int **)((long)in_RSI->_vptr_io_buf - lVar4);
    local_8 = lVar4 + 1;
  }
  return local_8;
}

Assistant:

size_t readto(io_buf& i, char*& pointer, char terminal)
{
  // Return a pointer to the bytes before the terminal.  Must be less than the buffer size.
  pointer = i.head;
  while (pointer < i.space.end() && *pointer != terminal) pointer++;
  if (pointer != i.space.end())
  {
    size_t n = pointer - i.head;
    i.head = pointer + 1;
    pointer -= n;
    return n + 1;
  }
  else
  {
    if (i.space.end() == i.space.end_array)
    {
      size_t left = i.space.end() - i.head;
      memmove(i.space.begin(), i.head, left);
      i.head = i.space.begin();
      i.space.end() = i.space.begin() + left;
      pointer = i.space.end();
    }
    if (i.current < i.files.size() && i.fill(i.files[i.current]) > 0)  // more bytes are read.
      return readto(i, pointer, terminal);
    else if (++i.current < i.files.size())  // no more bytes, so go to next file.
      return readto(i, pointer, terminal);
    else  // no more bytes to read, return everything we have.
    {
      size_t n = pointer - i.head;
      i.head = pointer;
      pointer -= n;
      return n;
    }
  }
}